

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

void __thiscall
gutil::Thread::create(Thread *this,ParallelFunction *fct,long start,long end,long step,int affinity)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  size_t __cpu;
  cpu_set_t cpuset;
  pthread_attr_t attr;
  cpu_set_t local_e8;
  pthread_attr_t local_68;
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(byte *)*in_RDI & 1) != 0) {
    pthread_cancel(*(pthread_t *)(*in_RDI + 8));
    pthread_join(*(pthread_t *)(*in_RDI + 8),(void **)0x0);
    *(undefined1 *)*in_RDI = 0;
  }
  pthread_attr_init(&local_68);
  if ((-1 < local_2c) && (iVar1 = getMaxThreads(), 1 < iVar1)) {
    iVar1 = getMaxThreads();
    iVar2 = getProcessingUnits();
    if (iVar1 == iVar2) {
      memset(&local_e8,0,0x80);
      if ((ulong)(long)local_2c >> 3 < 0x80) {
        uVar3 = (ulong)(long)local_2c >> 6;
        local_e8.__bits[uVar3] = 1L << ((byte)local_2c & 0x3f) | local_e8.__bits[uVar3];
      }
      pthread_attr_setaffinity_np(&local_68,0x80,&local_e8);
    }
  }
  *(undefined8 *)(*in_RDI + 0x10) = 0;
  *(undefined8 *)(*in_RDI + 0x18) = local_10;
  *(undefined8 *)(*in_RDI + 0x20) = local_18;
  *(undefined8 *)(*in_RDI + 0x28) = local_20;
  *(undefined8 *)(*in_RDI + 0x30) = local_28;
  pthread_create((pthread_t *)(*in_RDI + 8),&local_68,anon_unknown_0::ptfct,(void *)*in_RDI);
  pthread_attr_destroy(&local_68);
  *(undefined1 *)*in_RDI = 1;
  return;
}

Assistant:

void Thread::create(ParallelFunction &fct, long start, long end, long step,
                    int affinity)
{
  if (p->running)
  {
    pthread_cancel(p->thread);
    pthread_join(p->thread, 0);
    p->running=false;
  }

  pthread_attr_t attr;
  pthread_attr_init(&attr);

#ifdef _GNU_SOURCE

  if (affinity >= 0 && getMaxThreads() > 1 &&
      getMaxThreads() == getProcessingUnits())
  {
    cpu_set_t cpuset;
    CPU_ZERO(&cpuset);
    CPU_SET(affinity, &cpuset);

    pthread_attr_setaffinity_np(&attr, sizeof(cpu_set_t), &cpuset);
  }

#endif

  p->tfct=0;
  p->pfct=&fct;
  p->start=start;
  p->end=end;
  p->step=step;

#ifndef NDEBUG
  int err=
#endif
    pthread_create(&(p->thread), &attr, ptfct, p);

  pthread_attr_destroy(&attr);

  assert(err == 0);

  p->running=true;
}

void Thread::join()
{
  if (p->running)
  {
#ifndef NDEBUG
    int err=
#endif
      pthread_join(p->thread, 0);

    p->running=false;

    assert(err == 0);
  }
}

namespace
{

int procunits=0;
int nthreads=0;

}

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}

int Thread::getMaxThreads()
{
  if (nthreads <= 0)
  {
    nthreads=getProcessingUnits();
  }

  return nthreads;
}

void Thread::setMaxThreads(int n)
{
  if (n <= 0 || n > getProcessingUnits())
  {
    n=getProcessingUnits();
  }

  nthreads=n;
}

}